

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.h
# Opt level: O0

void __thiscall Assimp::Profiling::Profiler::BeginRegion(Profiler *this,string *region)

{
  mapped_type *pmVar1;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  rep local_20;
  key_type *local_18;
  string *region_local;
  Profiler *this_local;
  
  local_18 = region;
  region_local = (string *)this;
  local_20 = std::chrono::_V2::system_clock::now();
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           ::operator[](&this->regions,local_18);
  (pmVar1->__d).__r = local_20;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[8]>(&local_1b8,(char (*) [8])"START `");
  this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1b8,local_18);
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (this_01,(char (*) [2])0x2ba60e);
  Formatter::basic_formatter::operator_cast_to_string(&local_40,this_02);
  Logger::debug(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b8);
  return;
}

Assistant:

void BeginRegion(const std::string& region) {
        regions[region] = std::chrono::system_clock::now();
        ASSIMP_LOG_DEBUG((format("START `"),region,"`"));
    }